

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.h
# Opt level: O1

Pointer __thiscall
snestistics::AnnotationResolver::find_last_free_after_or_at
          (AnnotationResolver *this,Pointer p,Pointer stop)

{
  int iVar1;
  uint uVar2;
  pointer pAVar3;
  bool bVar4;
  Pointer in_EAX;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  if (p <= stop) {
    uVar2 = (this->_annotation_for_adress)._size;
    pAVar3 = (this->_annotations).
             super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar5 = 0;
    do {
      uVar6 = p + iVar5;
      if (uVar6 < uVar2) {
        if ((ulong)(long)(int)uVar2 <= (ulong)uVar6) {
          __assert_fail("index<_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                        ,0x12a,
                        "const T &snestistics::Array<int>::operator[](const uint64_t) const [T = int]"
                       );
        }
        lVar7 = (long)(this->_annotation_for_adress)._data[uVar6];
        if (lVar7 == -1) {
          bVar4 = false;
        }
        else {
          bVar4 = false;
          if (pAVar3[lVar7].type - ANNOTATION_FUNCTION < 2) {
            bVar4 = true;
            if (iVar5 == 0) {
              in_EAX = 0xffffffff;
            }
            else {
              in_EAX = pAVar3[lVar7].startOfRange - 1;
            }
          }
        }
        if (bVar4) {
          return in_EAX;
        }
      }
      iVar1 = p + iVar5;
      iVar5 = iVar5 + 1;
    } while (iVar1 + 1U <= stop);
  }
  return stop;
}

Assistant:

Pointer find_last_free_after_or_at(Pointer p, Pointer stop) const {

		// Assume in same bank
		for (uint32_t i = p; i <= stop; i++) {
			if (i >= _annotation_for_adress.size())
				continue;
			int ai = _annotation_for_adress[i];
			if (ai == -1)
				continue;
			const Annotation &a = _annotations[ai];
			if (a.type == ANNOTATION_FUNCTION || a.type == ANNOTATION_DATA) {
				if (i==p)
					return INVALID_POINTER; // No valid
				return a.startOfRange-1; // Min here if we stared in a function
			}
		}
		return stop;
	}